

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_cond_swap(mp_int *x0,mp_int *x1,uint swap)

{
  ulong *puVar1;
  size_t sVar2;
  BignumInt *pBVar3;
  BignumInt *pBVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  BignumInt mask;
  
  sVar2 = x0->nw;
  if (sVar2 == x1->nw) {
    if (sVar2 != 0) {
      pBVar3 = x0->w;
      pBVar4 = x1->w;
      sVar6 = 0;
      do {
        uVar5 = pBVar3[sVar6];
        uVar7 = (pBVar4[sVar6] ^ uVar5) & -(ulong)(swap & 1);
        pBVar3[sVar6] = uVar5 ^ uVar7;
        puVar1 = pBVar4 + sVar6;
        *puVar1 = *puVar1 ^ uVar7;
        sVar6 = sVar6 + 1;
      } while (sVar2 != sVar6);
    }
    return;
  }
  __assert_fail("x0->nw == x1->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0xa6,"void mp_cond_swap(mp_int *, mp_int *, unsigned int)");
}

Assistant:

void mp_cond_swap(mp_int *x0, mp_int *x1, unsigned swap)
{
    assert(x0->nw == x1->nw);
    volatile BignumInt mask = -(BignumInt)(1 & swap);
    for (size_t i = 0; i < x0->nw; i++) {
        BignumInt diff = (x0->w[i] ^ x1->w[i]) & mask;
        x0->w[i] ^= diff;
        x1->w[i] ^= diff;
    }
}